

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O3

int align_byte_sequence(rtr_bgpsec *data,stream *s,align_type type)

{
  long lVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  rtr_signature_seg *prVar7;
  rtr_secure_path_seg *prVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = data->target_as;
  *(uint *)(s->stream + s->w_head) =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar5 = *(int *)&s->w_head + 4;
  uVar4 = (ushort)uVar5;
  s->w_head = uVar4;
  prVar7 = (rtr_signature_seg *)&data->sigs;
  if (type == VALIDATION) {
    prVar7 = *(rtr_signature_seg **)prVar7;
  }
  prVar8 = data->path;
  if (prVar8 != (rtr_secure_path_seg *)0x0) {
    prVar7 = prVar7->next;
    do {
      uVar4 = (ushort)uVar5;
      if (prVar7 == (rtr_signature_seg *)0x0) {
        prVar7 = (rtr_signature_seg *)0x0;
      }
      else {
        uVar4 = prVar7->sig_len;
        puVar2 = s->stream;
        *(undefined4 *)(puVar2 + ((ulong)uVar5 & 0xffff) + 0x10) =
             *(undefined4 *)(prVar7->ski + 0x10);
        uVar3 = *(undefined8 *)(prVar7->ski + 8);
        puVar2 = puVar2 + ((ulong)uVar5 & 0xffff);
        *(undefined8 *)puVar2 = *(undefined8 *)prVar7->ski;
        *(undefined8 *)(puVar2 + 8) = uVar3;
        uVar5 = *(int *)&s->w_head + 0x14;
        s->w_head = (uint16_t)uVar5;
        *(ushort *)(s->stream + (uVar5 & 0xffff)) = uVar4 << 8 | uVar4 >> 8;
        uVar5 = *(int *)&s->w_head + 2;
        s->w_head = (uint16_t)uVar5;
        uVar4 = prVar7->sig_len;
        memcpy(s->stream + (uVar5 & 0xffff),prVar7->signature,(ulong)uVar4);
        uVar4 = s->w_head + uVar4;
        s->w_head = uVar4;
        prVar7 = prVar7->next;
      }
      s->stream[uVar4] = prVar8->pcount;
      uVar5 = *(int *)&s->w_head + 1;
      s->w_head = (uint16_t)uVar5;
      s->stream[uVar5 & 0xffff] = prVar8->flags;
      uVar6 = *(int *)&s->w_head + 1;
      s->w_head = (uint16_t)uVar6;
      uVar5 = prVar8->asn;
      *(uint *)(s->stream + (uVar6 & 0xffff)) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar5 = *(int *)&s->w_head + 4;
      uVar4 = (ushort)uVar5;
      s->w_head = uVar4;
      prVar8 = prVar8->next;
    } while (prVar8 != (rtr_secure_path_seg *)0x0);
  }
  s->stream[uVar4] = data->alg;
  uVar5 = *(int *)&s->w_head + 1;
  s->w_head = (uint16_t)uVar5;
  *(uint16_t *)(s->stream + (uVar5 & 0xffff)) = data->afi << 8 | data->afi >> 8;
  uVar5 = *(int *)&s->w_head + 2;
  s->w_head = (uint16_t)uVar5;
  s->stream[uVar5 & 0xffff] = data->safi;
  uVar5 = *(int *)&s->w_head + 1;
  s->w_head = (uint16_t)uVar5;
  s->stream[uVar5 & 0xffff] = data->nlri->nlri_len;
  uVar5 = *(int *)&s->w_head + 1;
  s->w_head = (uint16_t)uVar5;
  uVar6 = data->nlri->nlri_len + 7 >> 3;
  memcpy(s->stream + (uVar5 & 0xffff),data->nlri->nlri,(ulong)uVar6);
  s->w_head = s->w_head + (short)uVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int align_byte_sequence(const struct rtr_bgpsec *data, struct stream *s, enum align_type type)
{
	/* Variables used for network-to-host-order transformation. */
	uint32_t asn = 0;
	uint16_t afi = 0;

	/* Temp secure path and signature segments to prevent any
	 * alteration of the original data.
	 */
	struct rtr_secure_path_seg *tmp_sec = NULL;
	struct rtr_signature_seg *tmp_sig = NULL;

	/* The data alignment begins here, starting with the target ASN. */
	asn = htonl(data->target_as);
	write_stream(s, &asn, sizeof(asn));

	/* Depending on whether we are dealing with alignment for validation
	 * or signing, the first signature segment is skipped.
	 */
	if (type == VALIDATION)
		tmp_sig = data->sigs->next;
	else
		tmp_sig = data->sigs;

	tmp_sec = data->path;

	while (tmp_sec) {
		if (tmp_sig) {
			uint16_t sig_len = htons(tmp_sig->sig_len);

			/* Write the signature segment data to stream. */
			write_stream(s, tmp_sig->ski, SKI_SIZE);
			write_stream(s, &sig_len, sizeof(sig_len));
			write_stream(s, tmp_sig->signature, tmp_sig->sig_len);

			tmp_sig = tmp_sig->next;
		}

		/* Write the secure path segment data to stream. */
		write_stream(s, (uint8_t *)&tmp_sec->pcount, 1);
		write_stream(s, (uint8_t *)&tmp_sec->flags, 1);

		asn = htonl(tmp_sec->asn);
		write_stream(s, &asn, sizeof(asn));
		tmp_sec = tmp_sec->next;
	}

	/* Write the rest of the data to stream. */
	write_stream(s, (uint8_t *)&data->alg, 1);

	afi = htons(data->afi);
	write_stream(s, &afi, sizeof(afi));

	write_stream(s, (uint8_t *)&data->safi, 1);
	write_stream(s, (uint8_t *)&data->nlri->nlri_len, 1);

	/* Write the NLRI to stream */
	write_stream(s, data->nlri->nlri, NLRI_BYTE_LEN(data));

	return RTR_BGPSEC_SUCCESS;
}